

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O2

UBool __thiscall
icu_63::CurrencyPluralInfo::operator==(CurrencyPluralInfo *this,CurrencyPluralInfo *info)

{
  UBool UVar1;
  int iVar2;
  
  iVar2 = (*(this->fPluralRules->super_UObject)._vptr_UObject[3])
                    (this->fPluralRules,info->fPluralRules);
  if (((char)iVar2 != '\0') &&
     (UVar1 = Locale::operator==(this->fLocale,info->fLocale), UVar1 != '\0')) {
    UVar1 = Hashtable::equals(this->fPluralCountToCurrencyUnitPattern,
                              info->fPluralCountToCurrencyUnitPattern);
    return UVar1 != '\0';
  }
  return '\0';
}

Assistant:

UBool
CurrencyPluralInfo::operator==(const CurrencyPluralInfo& info) const {
#ifdef CURRENCY_PLURAL_INFO_DEBUG
    if (*fPluralRules == *info.fPluralRules) {
        std::cout << "same plural rules\n";
    }
    if (*fLocale == *info.fLocale) {
        std::cout << "same locale\n";
    }
    if (fPluralCountToCurrencyUnitPattern->equals(*info.fPluralCountToCurrencyUnitPattern)) {
        std::cout << "same pattern\n";
    }
#endif
    return *fPluralRules == *info.fPluralRules &&
           *fLocale == *info.fLocale &&
           fPluralCountToCurrencyUnitPattern->equals(*info.fPluralCountToCurrencyUnitPattern);
}